

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O1

float root(float x)

{
  ostream *poVar1;
  float fVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sqrt (",6);
  poVar1 = std::ostream::_M_insert<double>((double)x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (0.0 <= x) {
    return SQRT(x);
  }
  fVar2 = sqrtf(x);
  return fVar2;
}

Assistant:

float
root (float x)
{
    std::cout << "sqrt (" << x << ")" << std::endl;
    return sqrt (x);
}